

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-bool-type.cpp
# Opt level: O0

Up __thiscall yactfr::FixedLengthBooleanType::_clone(FixedLengthBooleanType *this)

{
  FixedLengthBitArrayType *in_RSI;
  undefined1 local_38 [12];
  ByteOrder local_2c;
  ByteOrder local_28;
  uint local_24;
  unique_ptr<const_yactfr::FixedLengthBooleanType,_std::default_delete<const_yactfr::FixedLengthBooleanType>_>
  local_20 [2];
  FixedLengthBooleanType *this_local;
  
  this_local = this;
  local_24 = DataType::alignment((DataType *)in_RSI);
  local_28 = FixedLengthBitArrayType::length(in_RSI);
  local_2c = FixedLengthBitArrayType::byteOrder(in_RSI);
  local_38._8_4_ = FixedLengthBitArrayType::bitOrder(in_RSI);
  DataType::attributes((DataType *)in_RSI);
  internal::tryCloneAttrs((MapItem *)local_38);
  create<unsigned_int,unsigned_int,yactfr::ByteOrder,yactfr::BitOrder,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((uint *)local_20,&local_24,&local_28,&local_2c,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             (local_38 + 8));
  std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>::
  unique_ptr<yactfr::FixedLengthBooleanType_const,std::default_delete<yactfr::FixedLengthBooleanType_const>,void>
            ((unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>> *)this,
             local_20);
  std::
  unique_ptr<const_yactfr::FixedLengthBooleanType,_std::default_delete<const_yactfr::FixedLengthBooleanType>_>
  ::~unique_ptr(local_20);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_38);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up FixedLengthBooleanType::_clone() const
{
    return FixedLengthBooleanType::create(this->alignment(), this->length(), this->byteOrder(),
                                          this->bitOrder(),
                                          internal::tryCloneAttrs(this->attributes()));
}